

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::~DBIter(DBIter *this)

{
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__DBIter_001380a8;
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[1])();
  }
  std::__cxx11::string::~string((string *)&this->saved_value_);
  std::__cxx11::string::~string((string *)&this->saved_key_);
  Status::~Status(&this->status_);
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

~DBIter() override { delete iter_; }